

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double **ppdVar13;
  uint uVar14;
  double *pdVar15;
  int k;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  allocator_type local_b9;
  ulong local_b8;
  double local_b0;
  double local_a8;
  int *local_a0;
  int *local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  
  local_a0 = categoryWeightsIndices;
  local_98 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&indexMaxScale,(long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount,
             (allocator_type *)&maxScaleFactor);
  std::vector<double,_std::allocator<double>_>::vector
            (&maxScaleFactor,(long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount,&local_b9
            );
  local_80 = (ulong)(count - 1);
  local_90 = (ulong)(uint)(~(count >> 0x1f) & count);
  for (uVar23 = 0; uVar23 != local_90; uVar23 = uVar23 + 1) {
    local_88 = (long)bufferIndices[uVar23];
    uVar20 = 0;
    pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[local_88];
    pdVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies[local_98[uVar23]];
    pdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights[local_a0[uVar23]];
    pdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
    dVar26 = *pdVar11;
    uVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    uVar16 = ~((int)uVar14 >> 0x1f) & uVar14;
    uVar17 = uVar16;
    while (bVar25 = uVar17 != 0, uVar17 = uVar17 - 1, bVar25) {
      pdVar12[uVar20] = dVar26 * pdVar15[uVar20];
      pdVar12[uVar20 + 1] = dVar26 * pdVar15[uVar20 + 1];
      pdVar12[uVar20 + 2] = dVar26 * pdVar15[uVar20 + 2];
      pdVar12[uVar20 + 3] = dVar26 * pdVar15[uVar20 + 3];
      uVar20 = uVar20 + 4;
    }
    iVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
    iVar9 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    for (lVar22 = 1; lVar22 < iVar9; lVar22 = lVar22 + 1) {
      pdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      lVar24 = 0;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = pdVar11[lVar22];
      iVar19 = (int)uVar20;
      uVar17 = uVar16;
      while (bVar25 = uVar17 != 0, uVar17 = uVar17 - 1, bVar25) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = pdVar15[iVar19 + lVar24];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar12[lVar24];
        auVar31 = vfmadd213sd_fma(auVar33,auVar27,auVar2);
        pdVar12[lVar24] = auVar31._0_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = pdVar15[(long)iVar19 + lVar24 + 1];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar12[lVar24 + 1];
        auVar31 = vfmadd213sd_fma(auVar34,auVar27,auVar3);
        pdVar12[lVar24 + 1] = auVar31._0_8_;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pdVar15[(long)iVar19 + lVar24 + 2];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pdVar12[lVar24 + 2];
        auVar31 = vfmadd213sd_fma(auVar35,auVar27,auVar4);
        pdVar12[lVar24 + 2] = auVar31._0_8_;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pdVar15[(long)iVar19 + lVar24 + 3];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pdVar12[lVar24 + 3];
        auVar31 = vfmadd213sd_fma(auVar36,auVar27,auVar5);
        pdVar12[lVar24 + 3] = auVar31._0_8_;
        lVar24 = lVar24 + 4;
      }
      uVar20 = (ulong)(uint)((int)lVar24 + iVar19 + iVar21 * 4);
    }
    lVar24 = 0;
    local_68 = pdVar10[1];
    local_a8 = *pdVar10;
    local_70 = pdVar10[2];
    local_b0 = pdVar10[3];
    local_b8 = uVar23;
    for (lVar22 = 0; lVar22 < (int)uVar14; lVar22 = lVar22 + 1) {
      pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_a8;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pdVar15[lVar24];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_68 * pdVar15[lVar24 + 1];
      auVar31 = vfmadd231sd_fma(auVar38,auVar28,auVar31);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_70;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pdVar15[lVar24 + 2];
      auVar31 = vfmadd231sd_fma(auVar31,auVar29,auVar6);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_b0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pdVar15[lVar24 + 3];
      auVar31 = vfmadd231sd_fma(auVar31,auVar30,auVar7);
      dVar26 = auVar31._0_8_;
      uVar14 = (uint)(this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
      if (*scaleBufferIndices == -1) {
        if ((uVar14 >> 8 & 1) != 0) goto LAB_0013063d;
      }
      else {
        if ((uVar14 >> 8 & 1) == 0) {
          iVar21 = scaleBufferIndices[uVar23];
          bVar25 = true;
        }
        else {
LAB_0013063d:
          iVar21 = (int)local_88 - (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount;
          bVar25 = false;
        }
        ppdVar13 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers;
        pdVar15 = ppdVar13[iVar21];
        if (uVar23 == 0) {
          indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = 0;
          uVar18 = 0;
          dVar1 = pdVar15[lVar22];
          auVar32 = ZEXT864((ulong)dVar1);
          maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = dVar1;
          for (uVar20 = 1; (uint)count != uVar20; uVar20 = uVar20 + 1) {
            if (bVar25) {
              iVar21 = scaleBufferIndices[uVar20];
            }
            else {
              iVar21 = bufferIndices[uVar20] - (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount;
            }
            dVar1 = ppdVar13[iVar21][lVar22];
            if (auVar32._0_8_ < dVar1) {
              indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22] = (int)uVar20;
              maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22] = dVar1;
              auVar32 = ZEXT864((ulong)dVar1);
              uVar18 = uVar20 & 0xffffffff;
            }
          }
        }
        else {
          uVar18 = (ulong)(uint)indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar22];
        }
        if (uVar23 != uVar18) {
          local_78 = dVar26;
          dVar26 = exp(pdVar15[lVar22] -
                       maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar22]);
          dVar26 = local_78 * dVar26;
          uVar23 = local_b8;
        }
      }
      pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
      if (uVar23 == 0) {
        pdVar15[lVar22] = dVar26;
      }
      else {
        dVar26 = dVar26 + pdVar15[lVar22];
        if (uVar23 == local_80) {
          dVar26 = log(dVar26);
          pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
          uVar23 = local_b8;
        }
        pdVar15[lVar22] = dVar26;
      }
      uVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
      lVar24 = lVar24 + 4;
    }
  }
  if (*scaleBufferIndices == -1) {
    uVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    if (((this->super_BeagleCPUImpl<double,_1,_0>).kFlags & 0x100) == 0) {
      uVar23 = (ulong)(~((int)uVar14 >> 0x1f) & uVar14);
      goto LAB_00130770;
    }
  }
  else {
    uVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
  }
  pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
  uVar23 = (ulong)(~((int)uVar14 >> 0x1f) & uVar14);
  for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
    pdVar15[uVar20] =
         maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar20] + pdVar15[uVar20];
  }
LAB_00130770:
  *outSumLogLikelihood = 0.0;
  auVar31 = ZEXT816(0) << 0x40;
  pdVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
  pdVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
  for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
    auVar37._8_8_ = 0;
    auVar37._0_8_ = pdVar10[uVar20];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pdVar15[uVar20];
    auVar31 = vfmadd231sd_fma(auVar31,auVar37,auVar8);
    *outSumLogLikelihood = auVar31._0_8_;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexMaxScale.super__Vector_base<int,_std::allocator<int>_>);
  return (uint)!NAN(auVar31._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                                const int* categoryWeightsIndices,
                                                                const int* stateFrequenciesIndices,
                                                                const int* scaleBufferIndices,
                                                                int count,
                                                                double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;

        const REALTYPE wt0 = wt[0];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            const REALTYPE wtl = wt[l];
            for (int k = 0; k < kPatternCount; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
            v += 4 * kExtraPatterns;
        }

        REALTYPE freq0, freq1, freq2, freq3;
        freq0 = frequencies[0];
        freq1 = frequencies[1];
        freq2 = frequencies[2];
        freq3 = frequencies[3];

        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum =
                freq0 * integrationTmp[u    ] +
                freq1 * integrationTmp[u + 1] +
                freq2 * integrationTmp[u + 2] +
                freq3 * integrationTmp[u + 3];

            u += 4;

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}